

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Algebra.h
# Opt level: O3

Vector<std::complex<float>,_4UL> *
Gs::operator*(Vector<std::complex<float>,_4UL> *__return_storage_ptr__,
             Matrix<std::complex<float>,_4UL,_4UL> *lhs,Vector<std::complex<float>,_4UL> *rhs)

{
  float fVar1;
  size_t r;
  long lVar2;
  long lVar3;
  float fVar4;
  float fVar6;
  undefined8 uVar5;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  
  (__return_storage_ptr__->x)._M_value = 0;
  (__return_storage_ptr__->y)._M_value = 0;
  (__return_storage_ptr__->z)._M_value = 0;
  (__return_storage_ptr__->w)._M_value = 0x3f800000;
  lVar2 = 0;
  do {
    (&__return_storage_ptr__->x)[lVar2]._M_value = 0;
    lVar3 = 0;
    fVar9 = 0.0;
    fVar10 = 0.0;
    do {
      uVar5 = *(undefined8 *)((long)&((complex<float> *)&lhs->m_[0]._M_value)->_M_value + lVar3 * 4)
      ;
      fVar4 = (float)uVar5;
      fVar6 = (float)((ulong)uVar5 >> 0x20);
      fVar7 = *(float *)((long)&(rhs->x)._M_value + lVar3);
      fVar1 = *(float *)((long)&(rhs->x)._M_value + lVar3 + 4);
      fVar8 = fVar7 * fVar4 - fVar6 * fVar1;
      fVar7 = fVar7 * fVar6 + fVar4 * fVar1;
      uVar5 = CONCAT44(fVar7,fVar8);
      if ((NAN(fVar8)) && (uVar5 = CONCAT44(fVar7,fVar8), NAN(fVar7))) {
        uVar5 = __mulsc3(fVar4,fVar6);
      }
      fVar9 = fVar9 + (float)uVar5;
      fVar10 = fVar10 + (float)((ulong)uVar5 >> 0x20);
      (&__return_storage_ptr__->x)[lVar2]._M_value = CONCAT44(fVar10,fVar9);
      lVar3 = lVar3 + 8;
    } while (lVar3 != 0x20);
    lVar2 = lVar2 + 1;
    lhs = (Matrix<std::complex<float>,_4UL,_4UL> *)((long)lhs + 8);
  } while (lVar2 != 4);
  return __return_storage_ptr__;
}

Assistant:

Vector<T, Rows> operator * (const Matrix<T, Rows, Cols>& lhs, const Vector<T, Cols>& rhs)
{
    Vector<T, Rows> result;

    for (std::size_t r = 0; r < Rows; ++r)
    {
        result[r] = T(0);
        for (std::size_t c = 0; c < Cols; ++c)
            result[r] += lhs(r, c)*rhs[c];
    }

    return result;
}